

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int prepareFreeAndCollectError(sqlite3 *db,sqlite3_stmt **ppStmt,char **pzErrmsg,char *zSql)

{
  undefined4 local_2c;
  int rc;
  char *zSql_local;
  char **pzErrmsg_local;
  sqlite3_stmt **ppStmt_local;
  sqlite3 *db_local;
  
  if (zSql == (char *)0x0) {
    local_2c = 7;
    *ppStmt = (sqlite3_stmt *)0x0;
  }
  else {
    local_2c = prepareAndCollectError(db,ppStmt,pzErrmsg,zSql);
    sqlite3_free(zSql);
  }
  return local_2c;
}

Assistant:

static int prepareFreeAndCollectError(
  sqlite3 *db, 
  sqlite3_stmt **ppStmt,
  char **pzErrmsg,
  char *zSql
){
  int rc;
  assert( *pzErrmsg==0 );
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
    *ppStmt = 0;
  }else{
    rc = prepareAndCollectError(db, ppStmt, pzErrmsg, zSql);
    sqlite3_free(zSql);
  }
  return rc;
}